

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_Next_EXIT(void)

{
  if (DAT_001e16a8._4_4_ < 2) {
    Error("[EXIT] fake instruction \"exit\" must be specifically enabled by --zxnext=cspect option",
          (char *)0x0,PASS3);
  }
  else {
    EmitByte(0xdd,true);
    EmitByte(0,false);
  }
  return;
}

Assistant:

static void OpCode_Next_EXIT() {	// this is fake instruction for CSpect emulator, not for real Z80N
		if (Options::syx.IsNextEnabled < 2) {
			Error("[EXIT] fake instruction \"exit\" must be specifically enabled by --zxnext=cspect option");
			return;
		}
		EmitByte(0xDD, true);
		EmitByte(0x00);
	}